

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::detail::Subcase::Subcase(Subcase *this,String *name,char *file,int line)

{
  long lVar1;
  undefined8 *puVar2;
  void *pvVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  const_iterator cVar7;
  ulong uVar8;
  IReporter **curr_rep;
  Subcase *this_00;
  undefined8 *puVar9;
  
  String::copy((String *)this,(EVP_PKEY_CTX *)name,(EVP_PKEY_CTX *)file);
  (this->m_signature).m_file = file;
  (this->m_signature).m_line = line;
  this->m_entered = false;
  lVar4 = g_cs;
  uVar8 = (*(long *)(g_cs + 0x1118) - *(long *)(g_cs + 0x1110) >> 3) * -0x3333333333333333;
  if (uVar8 < (ulong)(long)*(int *)(g_cs + 0x68)) {
    this_00 = this;
    if ((this->m_signature).m_name.field_0.buf[0x17] < '\0') {
      this_00 = (Subcase *)(this->m_signature).m_name.field_0.data.ptr;
    }
    lVar1 = *(long *)(g_cs + 0x10b8);
    bVar6 = *(bool *)(g_cs + 0x6d);
    bVar5 = anon_unknown_14::matchesAny
                      ((anon_unknown_14 *)this_00,*(char **)(lVar1 + 0x90),
                       *(vector<doctest::String,_std::allocator<doctest::String>_> **)(lVar1 + 0x98)
                       ,true,bVar6);
    if (!bVar5) {
      return;
    }
    bVar6 = anon_unknown_14::matchesAny
                      ((anon_unknown_14 *)this_00,*(char **)(lVar1 + 0xa8),
                       *(vector<doctest::String,_std::allocator<doctest::String>_> **)(lVar1 + 0xb0)
                       ,false,bVar6);
    if (bVar6) {
      return;
    }
  }
  if (uVar8 < (ulong)(long)*(int *)(lVar4 + 0x1158)) {
    *(undefined1 *)(lVar4 + 0x115c) = 1;
  }
  else {
    std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::push_back
              ((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *)
               (lVar4 + 0x1110),&this->m_signature);
    cVar7 = std::
            _Rb_tree<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::_Identity<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
            ::find((_Rb_tree<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::_Identity<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
                    *)(lVar4 + 0x1128),
                   (vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *)
                   (lVar4 + 0x1110));
    lVar1 = *(long *)(lVar4 + 0x1118);
    if (cVar7._M_node == (_Base_ptr)(lVar4 + 0x1130)) {
      *(int *)(lVar4 + 0x1158) =
           (int)((ulong)(lVar1 - *(long *)(lVar4 + 0x1110)) >> 3) * -0x33333333;
      this->m_entered = true;
      puVar2 = *(undefined8 **)(g_cs + 0x10d8);
      for (puVar9 = *(undefined8 **)(g_cs + 0x10d0); puVar9 != puVar2; puVar9 = puVar9 + 1) {
        (**(code **)(*(long *)*puVar9 + 0x38))((long *)*puVar9,this);
      }
    }
    else {
      *(undefined8 **)(lVar4 + 0x1118) = (undefined8 *)(lVar1 + -0x28);
      if ((*(char *)(lVar1 + -0x11) < '\0') &&
         (pvVar3 = *(void **)(lVar1 + -0x28), pvVar3 != (void *)0x0)) {
        operator_delete__(pvVar3);
        return;
      }
    }
  }
  return;
}

Assistant:

Subcase::Subcase(const String& name, const char* file, int line)
            : m_signature({name, file, line}) {
        auto* s = g_cs;

        // check subcase filters
        if(s->subcasesStack.size() < size_t(s->subcase_filter_levels)) {
            if(!matchesAny(m_signature.m_name.c_str(), s->filters[6], true, s->case_sensitive))
                return;
            if(matchesAny(m_signature.m_name.c_str(), s->filters[7], false, s->case_sensitive))
                return;
        }
        
        // if a Subcase on the same level has already been entered
        if(s->subcasesStack.size() < size_t(s->subcasesCurrentMaxLevel)) {
            s->should_reenter = true;
            return;
        }

        // push the current signature to the stack so we can check if the
        // current stack + the current new subcase have been traversed
        s->subcasesStack.push_back(m_signature);
        if(s->subcasesPassed.count(s->subcasesStack) != 0) {
            // pop - revert to previous stack since we've already passed this
            s->subcasesStack.pop_back();
            return;
        }

        s->subcasesCurrentMaxLevel = s->subcasesStack.size();
        m_entered = true;

        DOCTEST_ITERATE_THROUGH_REPORTERS(subcase_start, m_signature);
    }